

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableDeathTest_InsertSizeTypeOverflow_Test::~HashtableDeathTest_InsertSizeTypeOverflow_Test
          (HashtableDeathTest_InsertSizeTypeOverflow_Test *this)

{
  void *in_RDI;
  
  ~HashtableDeathTest_InsertSizeTypeOverflow_Test
            ((HashtableDeathTest_InsertSizeTypeOverflow_Test *)0x9f6948);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(HashtableDeathTest, InsertSizeTypeOverflow) {
  static const int kMax = 256;
  vector<int> test_data(kMax);
  for (int i = 0; i < kMax; ++i) {
    test_data[i] = i + 1000;
  }

  sparse_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> shs;
  dense_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> dhs;
  dhs.set_empty_key(-1);

  // Test we are using the correct allocator
  EXPECT_TRUE(shs.get_allocator().is_custom_alloc());
  EXPECT_TRUE(dhs.get_allocator().is_custom_alloc());

  // Test size_type overflow in insert(it, it)
  EXPECT_THROW(dhs.insert(test_data.begin(), test_data.end()),
               std::length_error);
  EXPECT_THROW(shs.insert(test_data.begin(), test_data.end()),
               std::length_error);
}